

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O3

ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *
JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>::New<Memory::Recycler>
          (Recycler *alloc,uint *buffer,int count)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  Recycler *this;
  undefined4 *puVar4;
  ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *pRVar5;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  local_58 = (undefined1  [8])&ReadOnlyList<unsigned_int,Memory::Recycler,DefaultComparer>::typeinfo
  ;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_278496;
  data.filename._0_4_ = 0x46;
  this = Memory::Recycler::TrackAllocInfo(alloc,(TrackAllocData *)local_58);
  BVar3 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1ef,"(ExceptionCheck::CanHandleOutOfMemory())",
                       "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar2) goto LAB_00781dc4;
    *puVar4 = 0;
  }
  pRVar5 = (ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *)
           Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                     (this,0x20);
  if (pRVar5 == (ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1f2,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar2) {
LAB_00781dc4:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pRVar5->_vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014db308;
  Memory::Recycler::WBSetBit((char *)&pRVar5->buffer);
  (pRVar5->buffer).ptr = buffer;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&pRVar5->buffer);
  pRVar5->count = count;
  pRVar5->alloc = alloc;
  return pRVar5;
}

Assistant:

static ReadOnlyList * New(UAllocator* alloc, __in_ecount(count) T* buffer, DECLSPEC_GUARD_OVERFLOW int count)
        {
            return AllocatorNew(UAllocator, alloc, ReadOnlyList, buffer, count, alloc);
        }